

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONNode.h
# Opt level: O2

json_iterator __thiscall JSONNode::end(JSONNode *this)

{
  uchar uVar1;
  json_string *__lhs;
  internalJSONNode *piVar2;
  JSONNode *in_RSI;
  bool condition;
  allocator local_41;
  json_string local_40;
  
  piVar2 = in_RSI->internal;
  std::__cxx11::string::string((string *)&local_40,"no internal",&local_41);
  JSONDebug::_JSON_ASSERT(piVar2 != (internalJSONNode *)0x0,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  uVar1 = type(in_RSI);
  condition = true;
  if (uVar1 != '\x05') {
    uVar1 = type(in_RSI);
    condition = uVar1 == '\x04';
  }
  __lhs = jsonSingletonERROR_NON_ITERATABLE::getValue_abi_cxx11_();
  std::operator+(&local_40,__lhs,"end");
  JSONDebug::_JSON_ASSERT(condition,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  makeUniqueInternal(in_RSI);
  piVar2 = (internalJSONNode *)internalJSONNode::end(in_RSI->internal);
  this->internal = piVar2;
  return (json_iterator)(JSONNode **)this;
}

Assistant:

inline JSONNode::json_iterator JSONNode::end(void) json_nothrow {
	   JSON_CHECK_INTERNAL();
	   JSON_ASSERT(type() == JSON_NODE || type() == JSON_ARRAY, json_global(ERROR_NON_ITERATABLE) + JSON_TEXT("end"));
	   makeUniqueInternal();
	   return json_iterator(internal -> end());
    }